

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  int iVar1;
  long lVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow *pIVar4;
  long lVar5;
  long lVar6;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  if ((GImGui->NavWindowingTarget->Flags & 0x8000000) == 0) {
    iVar1 = (GImGui->WindowsFocusOrder).Size;
    lVar5 = (long)iVar1;
    do {
      if (lVar5 < 1) {
        lVar6 = 0xffffffff;
        break;
      }
      lVar6 = lVar5 + -1;
      lVar2 = lVar5 + -1;
      lVar5 = lVar6;
    } while ((GImGui->WindowsFocusOrder).Data[lVar2] != GImGui->NavWindowingTarget);
    pIVar4 = FindWindowNavFocusable((int)lVar6 + focus_change_dir,-0x7fffffff,focus_change_dir);
    if (pIVar4 == (ImGuiWindow *)0x0) {
      pIVar4 = FindWindowNavFocusable
                         (focus_change_dir >> 0x1f & iVar1 - 1U,(int)lVar6,focus_change_dir);
    }
    if (pIVar4 != (ImGuiWindow *)0x0) {
      pIVar3->NavWindowingTargetAnim = pIVar4;
      pIVar3->NavWindowingTarget = pIVar4;
    }
    pIVar3->NavWindowingToggleLayer = false;
  }
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = FindWindowFocusIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavFocusable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavFocusable((focus_change_dir < 0) ? (g.WindowsFocusOrder.Size - 1) : 0, i_current, focus_change_dir);
    if (window_target) // Don't reset windowing target if there's a single window in the list
        g.NavWindowingTarget = g.NavWindowingTargetAnim = window_target;
    g.NavWindowingToggleLayer = false;
}